

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.h
# Opt level: O1

ExpectedRef<const_Mapping,_std::string> * __thiscall
yaml::Value::getMapping_abi_cxx11_
          (ExpectedRef<const_Mapping,_std::string> *__return_storage_ptr__,Value *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr local_58;
  size_type local_50;
  undefined1 local_48 [40];
  size_t sStack_20;
  
  if (this->type_ == Mapping) {
    (__return_storage_ptr__->field_0).value_._M_data = &this->mapping_;
    __return_storage_ptr__->has_value_ = true;
  }
  else {
    local_58 = (_Base_ptr)local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Value is not of Mapping type","");
    if (local_58 == (_Base_ptr)local_48) {
      sStack_20 = local_48._8_8_;
      local_48._16_8_ = (_Base_ptr)(local_48 + 0x20);
    }
    else {
      local_48._16_8_ = local_58;
    }
    local_48._33_7_ = local_48._1_7_;
    local_48[0x20] = local_48[0];
    paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_0 = paVar1;
    if ((_Base_ptr)local_48._16_8_ == (_Base_ptr)(local_48 + 0x20)) {
      paVar1->_M_allocated_capacity = local_48._32_8_;
      *(size_t *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) = sStack_20;
    }
    else {
      (__return_storage_ptr__->field_0).value_._M_data = (Mapping *)local_48._16_8_;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
           local_48._32_8_;
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_50;
    __return_storage_ptr__->has_value_ = false;
  }
  return __return_storage_ptr__;
}

Assistant:

ExpectedRef<const Mapping, std::string> getMapping() const {
		if (type_ != Type::Mapping)
			return Unexpected<std::string>("Value is not of Mapping type");
		return std::cref(mapping_);
	}